

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiny_gltf.h
# Opt level: O0

bool __thiscall tinygltf::BufferView::operator==(BufferView *this,BufferView *other)

{
  __type _Var1;
  bool bVar2;
  long in_RSI;
  Value *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *unaff_retaddr;
  Value *in_stack_ffffffffffffffd8;
  bool local_11;
  
  local_11 = false;
  if ((((*(int *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
                   *)&in_RDI->string_value_ + 1) == *(int *)(in_RSI + 0x20)) &&
       (local_11 = false,
       (in_RDI->binary_value_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
       _M_impl.super__Vector_impl_data._M_start == *(pointer *)(in_RSI + 0x30))) &&
      (local_11 = false, *(long *)((long)&in_RDI->string_value_ + 0x18) == *(long *)(in_RSI + 0x28))
      ) && (local_11 = false,
           (in_RDI->binary_value_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
           ._M_impl.super__Vector_impl_data._M_finish == *(pointer *)(in_RSI + 0x38))) {
    _Var1 = std::operator==(unaff_retaddr,
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            in_RDI);
    local_11 = false;
    if ((_Var1) &&
       (local_11 = false,
       *(int *)&(in_RDI->binary_value_).
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage == *(int *)(in_RSI + 0x40))) {
      bVar2 = std::operator==((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinygltf::Value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinygltf::Value>_>_>
                               *)in_RDI,
                              (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinygltf::Value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinygltf::Value>_>_>
                               *)in_stack_ffffffffffffffd8);
      local_11 = false;
      if (bVar2) {
        bVar2 = Value::operator==(in_RDI,in_stack_ffffffffffffffd8);
        local_11 = false;
        if (bVar2) {
          local_11 = (in_RDI[2].string_value_.field_2._M_local_buf[0] & 1U) ==
                     (*(byte *)(in_RSI + 0x150) & 1);
        }
      }
    }
  }
  return local_11;
}

Assistant:

bool BufferView::operator==(const BufferView &other) const {
  return this->buffer == other.buffer && this->byteLength == other.byteLength &&
         this->byteOffset == other.byteOffset &&
         this->byteStride == other.byteStride && this->name == other.name &&
         this->target == other.target && this->extensions == other.extensions &&
         this->extras == other.extras &&
         this->dracoDecoded == other.dracoDecoded;
}